

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_unicode.c
# Opt level: O0

int PHYSFS_utf8stricmp(char *str1,char *str2)

{
  PHYSFS_uint32 PVar1;
  uint local_50;
  uint local_4c;
  PHYSFS_uint32 cp2;
  PHYSFS_uint32 cp1;
  int tail2;
  int head2;
  int tail1;
  int head1;
  PHYSFS_uint32 folded2 [3];
  PHYSFS_uint32 folded1 [3];
  char *str2_local;
  char *str1_local;
  
  str2_local = str1;
  folded1._4_8_ = str2;
  head2 = 0;
  tail2 = 0;
  cp1 = 0;
  cp2 = 0;
  do {
    if (head2 == tail2) {
      PVar1 = utf8codepoint(&str2_local);
      head2 = PHYSFS_caseFold(PVar1,folded2 + 1);
      local_4c = folded2[1];
      tail2 = 1;
    }
    else {
      local_4c = folded2[(long)tail2 + 1];
      tail2 = tail2 + 1;
    }
    if (cp1 == cp2) {
      PVar1 = utf8codepoint((char **)(folded1 + 1));
      cp1 = PHYSFS_caseFold(PVar1,(PHYSFS_uint32 *)&tail1);
      local_50 = tail1;
      cp2 = 1;
    }
    else {
      local_50 = (&tail1)[(int)cp2];
      cp2 = cp2 + 1;
    }
    if (local_4c < local_50) {
      return -1;
    }
    if (local_50 < local_4c) {
      return 1;
    }
  } while (local_4c != 0);
  return 0;
}

Assistant:

int PHYSFS_utf8stricmp(const char *str1, const char *str2)
{
    UTFSTRICMP(8);
}